

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86.cpp
# Opt level: O2

int __thiscall ncnn::Convolution1D_x86::create_pipeline(Convolution1D_x86 *this,Option *param_1)

{
  long lVar1;
  uint uVar2;
  _func_int *p_Var3;
  long lVar4;
  size_t sVar5;
  size_t sVar6;
  void *pvVar7;
  int k_2;
  uint uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  undefined4 *puVar13;
  uint _c;
  long lVar14;
  ulong uVar15;
  int k_5;
  uint uVar16;
  int iVar17;
  long lVar18;
  undefined4 *puVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  uint _w;
  ulong uVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  undefined4 *puVar27;
  long lVar28;
  int iVar29;
  long lVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  ulong uVar36;
  long lVar37;
  int k_1;
  long lVar38;
  undefined4 *puVar39;
  
  p_Var3 = this->_vptr_Convolution1D_x86[-3];
  if (*(int *)(&this->field_0x140 + (long)p_Var3) != 0) {
    return 0;
  }
  uVar2 = *(uint *)(&this->field_0xd4 + (long)p_Var3);
  lVar14 = (long)(int)uVar2;
  uVar15 = (long)*(int *)(&this->field_0xf0 + (long)p_Var3) / (long)(int)uVar2;
  _c = *(uint *)(&this->field_0xd0 + (long)p_Var3);
  lVar33 = (long)(int)_c;
  uVar8 = (uint)((long)((ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff) /
                (long)(int)_c);
  uVar16 = uVar8;
  if (lVar33 < 4) {
    if ((int)_c < 2) {
      if ((int)uVar8 < 4) {
        _w = uVar2;
        if (1 < (int)uVar8) {
          _w = uVar2 * 2;
          uVar16 = (uVar8 & 1) + 1;
        }
      }
      else {
        _w = uVar2 * 4;
        uVar16 = (uVar8 & 1) + (uVar8 >> 2) + (uint)((uVar8 >> 1 & 1) != 0);
      }
    }
    else if ((int)uVar8 < 4) {
      if ((int)uVar8 < 2) {
        _c = (_c & 1) + 1;
        _w = uVar2 * 2;
      }
      else {
        _c = (_c & 1) + 1;
        _w = uVar2 * 4;
        uVar16 = (uVar8 & 1) + 1;
      }
    }
    else {
      uVar16 = (uVar8 & 1) + (uVar8 >> 2) + (uint)((uVar8 >> 1 & 1) != 0);
      _w = uVar2 * 8;
      _c = (_c & 1) + 1;
    }
  }
  else {
    if ((int)uVar8 < 4) {
      if ((int)uVar8 < 2) {
        _w = uVar2 * 4;
        _c = (_c & 1) + (_c >> 2) + (uint)((_c >> 1 & 1) != 0);
        goto LAB_004915c7;
      }
      _w = uVar2 * 8;
      uVar16 = (uVar8 & 1) + 1;
    }
    else {
      _w = uVar2 << 4;
      uVar16 = (uVar8 & 1) + (uVar8 >> 2) + (uint)((uVar8 >> 1 & 1) != 0);
    }
    _c = (_c & 1) + (_c >> 2) + (uint)((_c >> 1 & 1) != 0);
  }
LAB_004915c7:
  Mat::create(&this->weight_data_tm,_w,uVar16,_c,4,(Allocator *)0x0);
  lVar4 = *(long *)(&this->field_0x148 + (long)p_Var3);
  sVar5 = (this->weight_data_tm).elemsize;
  sVar6 = (this->weight_data_tm).cstep;
  iVar20 = 0;
  uVar15 = 0;
  if (0 < (int)uVar2) {
    uVar15 = (ulong)uVar2;
  }
  pvVar7 = (this->weight_data_tm).data;
  lVar10 = (long)(int)uVar8;
  iVar25 = uVar2 * uVar8;
  iVar9 = iVar25 * 4;
  iVar17 = iVar25 * 3;
  lVar11 = lVar14 * 0x10;
  lVar22 = lVar14 * 4;
  iVar29 = iVar25 * 2;
  lVar1 = lVar14 * 8;
  for (uVar36 = 0; (long)(uVar36 | 3) < lVar33; uVar36 = uVar36 + 4) {
    lVar12 = lVar4 + (long)iVar25 * 4;
    lVar26 = lVar4 + (long)iVar29 * 4;
    lVar28 = lVar4 + (long)iVar17 * 4;
    lVar37 = lVar4 + (long)iVar20 * 4;
    puVar19 = (undefined4 *)((uVar36 >> 2) * sVar5 * sVar6 + (long)pvVar7);
    lVar24 = 0;
    lVar21 = lVar12;
    lVar32 = lVar26;
    lVar34 = lVar37;
    lVar35 = lVar28;
    for (uVar31 = 0; (long)(uVar31 | 3) < lVar10; uVar31 = uVar31 + 4) {
      lVar30 = lVar24;
      for (uVar23 = 0; uVar23 != uVar15; uVar23 = uVar23 + 1) {
        lVar18 = lVar30;
        for (lVar38 = 0; (int)lVar38 != 0x40; lVar38 = lVar38 + 0x10) {
          *(undefined4 *)((long)puVar19 + lVar38) = *(undefined4 *)(lVar37 + lVar18);
          *(undefined4 *)((long)puVar19 + lVar38 + 4) = *(undefined4 *)(lVar12 + lVar18);
          *(undefined4 *)((long)puVar19 + lVar38 + 8) = *(undefined4 *)(lVar26 + lVar18);
          *(undefined4 *)((long)puVar19 + lVar38 + 0xc) = *(undefined4 *)(lVar28 + lVar18);
          lVar18 = lVar18 + lVar22;
        }
        lVar30 = lVar30 + 4;
        puVar19 = (undefined4 *)((long)puVar19 + lVar38);
      }
      lVar24 = lVar24 + lVar11;
      lVar21 = lVar21 + lVar11;
      lVar32 = lVar32 + lVar11;
      lVar35 = lVar35 + lVar11;
      lVar34 = lVar34 + lVar11;
    }
    for (; (long)(uVar31 | 1) < lVar10; uVar31 = uVar31 + 2) {
      lVar12 = lVar34;
      lVar26 = lVar35;
      lVar28 = lVar32;
      lVar37 = lVar21;
      for (uVar23 = 0; uVar23 != uVar15; uVar23 = uVar23 + 1) {
        lVar30 = 0;
        for (lVar24 = 0; (int)lVar24 != 0x20; lVar24 = lVar24 + 0x10) {
          *(undefined4 *)((long)puVar19 + lVar24) = *(undefined4 *)(lVar12 + lVar30);
          *(undefined4 *)((long)puVar19 + lVar24 + 4) = *(undefined4 *)(lVar37 + lVar30);
          *(undefined4 *)((long)puVar19 + lVar24 + 8) = *(undefined4 *)(lVar28 + lVar30);
          *(undefined4 *)((long)puVar19 + lVar24 + 0xc) = *(undefined4 *)(lVar26 + lVar30);
          lVar30 = lVar30 + lVar22;
        }
        lVar37 = lVar37 + 4;
        lVar28 = lVar28 + 4;
        lVar26 = lVar26 + 4;
        lVar12 = lVar12 + 4;
        puVar19 = (undefined4 *)((long)puVar19 + lVar24);
      }
      lVar21 = lVar21 + lVar1;
      lVar32 = lVar32 + lVar1;
      lVar35 = lVar35 + lVar1;
      lVar34 = lVar34 + lVar1;
    }
    for (; (long)uVar31 < lVar10; uVar31 = uVar31 + 1) {
      for (uVar23 = 0; uVar15 != uVar23; uVar23 = uVar23 + 1) {
        *puVar19 = *(undefined4 *)(lVar34 + uVar23 * 4);
        puVar19[1] = *(undefined4 *)(lVar21 + uVar23 * 4);
        puVar19[2] = *(undefined4 *)(lVar32 + uVar23 * 4);
        puVar19[3] = *(undefined4 *)(lVar35 + uVar23 * 4);
        puVar19 = puVar19 + 4;
      }
      lVar35 = lVar35 + lVar22;
      lVar32 = lVar32 + lVar22;
      lVar21 = lVar21 + lVar22;
      lVar34 = lVar34 + lVar22;
    }
    iVar20 = iVar20 + iVar9;
    iVar25 = iVar25 + iVar9;
    iVar17 = iVar17 + iVar9;
    iVar29 = iVar29 + iVar9;
  }
  lVar28 = *(long *)(&this->field_0x148 + (long)p_Var3);
  sVar5 = (this->weight_data_tm).elemsize;
  sVar6 = (this->weight_data_tm).cstep;
  pvVar7 = (this->weight_data_tm).data;
  iVar17 = uVar2 * uVar8 * 2;
  lVar4 = lVar28 + (long)(int)(uVar2 * 3) * 4;
  lVar12 = lVar28 + (long)(int)(uVar2 * 2) * 4;
  lVar26 = lVar28 + lVar14 * 4;
  for (; (long)(uVar36 | 1) < lVar33; uVar36 = uVar36 + 2) {
    lVar34 = (long)iVar25;
    lVar37 = lVar4 + lVar34 * 4;
    lVar21 = lVar12 + lVar34 * 4;
    lVar32 = lVar26 + lVar34 * 4;
    lVar34 = lVar28 + lVar34 * 4;
    lVar18 = (long)iVar20;
    lVar35 = lVar4 + lVar18 * 4;
    lVar24 = lVar12 + lVar18 * 4;
    lVar30 = lVar26 + lVar18 * 4;
    lVar18 = lVar28 + lVar18 * 4;
    puVar19 = (undefined4 *)
              ((ulong)(((uint)(uVar36 >> 2) & 0x3fffffff) + (uint)(((uint)uVar36 >> 1 & 1) != 0)) *
               sVar5 * sVar6 + (long)pvVar7);
    for (uVar31 = 0; (long)(uVar31 | 3) < lVar10; uVar31 = uVar31 + 4) {
      puVar39 = puVar19;
      for (lVar38 = 0; uVar15 * 4 - lVar38 != 0; lVar38 = lVar38 + 4) {
        puVar19[lVar38 * 2] = *(undefined4 *)(lVar18 + lVar38);
        puVar19[lVar38 * 2 + 1] = *(undefined4 *)(lVar30 + lVar38);
        puVar19[lVar38 * 2 + 2] = *(undefined4 *)(lVar24 + lVar38);
        puVar19[lVar38 * 2 + 3] = *(undefined4 *)(lVar35 + lVar38);
        puVar19[lVar38 * 2 + 4] = *(undefined4 *)(lVar34 + lVar38);
        puVar19[lVar38 * 2 + 5] = *(undefined4 *)(lVar32 + lVar38);
        puVar19[lVar38 * 2 + 6] = *(undefined4 *)(lVar21 + lVar38);
        puVar19[lVar38 * 2 + 7] = *(undefined4 *)(lVar37 + lVar38);
        puVar39 = puVar39 + 8;
      }
      lVar37 = lVar37 + lVar11;
      lVar21 = lVar21 + lVar11;
      lVar32 = lVar32 + lVar11;
      lVar34 = lVar34 + lVar11;
      lVar35 = lVar35 + lVar11;
      lVar24 = lVar24 + lVar11;
      lVar30 = lVar30 + lVar11;
      lVar18 = lVar18 + lVar11;
      puVar19 = puVar39;
    }
    for (; (long)(uVar31 | 1) < lVar10; uVar31 = uVar31 + 2) {
      lVar37 = lVar34;
      lVar21 = lVar18;
      for (uVar23 = 0; uVar23 != uVar15; uVar23 = uVar23 + 1) {
        lVar32 = 0;
        for (lVar35 = 0; (int)lVar35 != 0x10; lVar35 = lVar35 + 8) {
          *(undefined4 *)((long)puVar19 + lVar35) = *(undefined4 *)(lVar21 + lVar32);
          *(undefined4 *)((long)puVar19 + lVar35 + 4) = *(undefined4 *)(lVar37 + lVar32);
          lVar32 = lVar32 + lVar22;
        }
        puVar19 = (undefined4 *)((long)puVar19 + lVar35);
        lVar21 = lVar21 + 4;
        lVar37 = lVar37 + 4;
      }
      lVar18 = lVar18 + lVar1;
      lVar34 = lVar34 + lVar1;
    }
    for (; (long)uVar31 < lVar10; uVar31 = uVar31 + 1) {
      for (uVar23 = 0; uVar15 != uVar23; uVar23 = uVar23 + 1) {
        *puVar19 = *(undefined4 *)(lVar18 + uVar23 * 4);
        puVar19[1] = *(undefined4 *)(lVar34 + uVar23 * 4);
        puVar19 = puVar19 + 2;
      }
      lVar34 = lVar34 + lVar22;
      lVar18 = lVar18 + lVar22;
    }
    iVar20 = iVar20 + iVar17;
    iVar25 = iVar25 + iVar17;
  }
  lVar4 = *(long *)(&this->field_0x148 + (long)p_Var3);
  pvVar7 = (this->weight_data_tm).data;
  sVar5 = (this->weight_data_tm).elemsize;
  sVar6 = (this->weight_data_tm).cstep;
  for (; (long)uVar36 < lVar33; uVar36 = uVar36 + 1) {
    lVar22 = lVar4 + lVar14 * 4 + (long)iVar20 * 4;
    puVar19 = (undefined4 *)(lVar4 + (long)iVar20 * 4);
    puVar39 = (undefined4 *)
              ((ulong)(((uint)uVar36 & 1) + ((uint)(uVar36 >> 2) & 0x3fffffff) +
                      (uint)(((uint)uVar36 >> 1 & 1) != 0)) * sVar5 * sVar6 + (long)pvVar7);
    for (uVar31 = 0; (long)(uVar31 | 3) < lVar10; uVar31 = uVar31 + 4) {
      puVar13 = puVar19;
      for (uVar23 = 0; uVar23 != uVar15; uVar23 = uVar23 + 1) {
        puVar27 = puVar13;
        for (lVar12 = 0; (int)lVar12 != 0x10; lVar12 = lVar12 + 4) {
          *(undefined4 *)((long)puVar39 + lVar12) = *puVar27;
          puVar27 = puVar27 + lVar14;
        }
        puVar39 = (undefined4 *)((long)puVar39 + lVar12);
        puVar13 = puVar13 + 1;
      }
      puVar19 = puVar19 + lVar14 * 4;
      lVar22 = lVar22 + lVar11;
    }
    for (; (long)(uVar31 | 1) < lVar10; uVar31 = uVar31 + 2) {
      for (uVar23 = 0; uVar15 != uVar23; uVar23 = uVar23 + 1) {
        *puVar39 = puVar19[uVar23];
        puVar39[1] = *(undefined4 *)(lVar22 + uVar23 * 4);
        puVar39 = puVar39 + 2;
      }
      lVar22 = lVar22 + lVar1;
      puVar19 = puVar19 + lVar14 * 2;
    }
    for (; (long)uVar31 < lVar10; uVar31 = uVar31 + 1) {
      for (lVar22 = 0; uVar15 * 4 - lVar22 != 0; lVar22 = lVar22 + 4) {
        *(undefined4 *)((long)puVar39 + lVar22) = *(undefined4 *)((long)puVar19 + lVar22);
      }
      puVar19 = puVar19 + lVar14;
      puVar39 = (undefined4 *)((long)puVar39 + lVar22);
    }
    iVar20 = iVar20 + uVar8 * uVar2;
  }
  return 0;
}

Assistant:

int Convolution1D_x86::create_pipeline(const Option& /*opt*/)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    convolution1d_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w);

    return 0;
}